

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

char_t * pugi::impl::anon_unknown_0::
         strconv_attribute_impl<pugi::impl::(anonymous_namespace)::opt_true>::parse_wconv
                   (char_t *s,char_t end_quote)

{
  size_t sVar1;
  byte *pbVar2;
  char_t *pcVar3;
  byte bVar4;
  byte bVar5;
  byte *s_00;
  gap g;
  gap local_38;
  
  local_38.end = (char_t *)0x0;
  local_38.size = 0;
  do {
    sVar1 = local_38.size;
    bVar4 = *s;
    bVar5 = (anonymous_namespace)::chartype_table[bVar4];
    s_00 = (byte *)s;
    if ((bVar5 & 4) == 0) {
      pbVar2 = (byte *)s + 2;
      do {
        s_00 = pbVar2;
        bVar4 = s_00[-1];
        bVar5 = (anonymous_namespace)::chartype_table[bVar4];
        if ((bVar5 & 4) != 0) {
          s_00 = s_00 + -1;
          goto LAB_00153007;
        }
        bVar4 = *s_00;
        bVar5 = (anonymous_namespace)::chartype_table[bVar4];
        if ((bVar5 & 4) != 0) goto LAB_00153007;
        bVar4 = s_00[1];
        bVar5 = (anonymous_namespace)::chartype_table[bVar4];
        if ((bVar5 & 4) != 0) {
          s_00 = s_00 + 1;
          goto LAB_00153007;
        }
        bVar4 = s_00[2];
        bVar5 = (anonymous_namespace)::chartype_table[bVar4];
        pbVar2 = s_00 + 4;
      } while ((bVar5 & 4) == 0);
      s_00 = s_00 + 2;
    }
LAB_00153007:
    if (bVar4 == end_quote) {
      pcVar3 = gap::flush(&local_38,(char_t *)s_00);
      *pcVar3 = '\0';
      return (char_t *)(s_00 + 1);
    }
    if ((bVar5 & 8) == 0) {
      if (bVar4 == 0x26) {
        s = strconv_escape((char_t *)s_00,&local_38);
      }
      else {
        if (bVar4 == 0) {
          return (char_t *)0x0;
        }
        s = (char_t *)(s_00 + 1);
      }
    }
    else {
      s = (char_t *)(s_00 + 1);
      *s_00 = 0x20;
      if ((bVar4 == 0xd) && (*s == 10)) {
        if ((byte *)local_38.end != (byte *)0x0) {
          if (s < local_38.end) {
            __assert_fail("s >= end",
                          "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/pugixml.cpp"
                          ,0x999,
                          "void pugi::impl::(anonymous namespace)::gap::push(char_t *&, size_t)");
          }
          memmove(local_38.end + -local_38.size,local_38.end,(long)s - (long)local_38.end);
        }
        s = (char_t *)(s_00 + 2);
        local_38.size = sVar1 + 1;
        local_38.end = s;
      }
    }
  } while( true );
}

Assistant:

static char_t* parse_wconv(char_t* s, char_t end_quote)
		{
			gap g;

			while (true)
			{
				PUGI_IMPL_SCANWHILE_UNROLL(!PUGI_IMPL_IS_CHARTYPE(ss, ct_parse_attr_ws));

				if (*s == end_quote)
				{
					*g.flush(s) = 0;

					return s + 1;
				}
				else if (PUGI_IMPL_IS_CHARTYPE(*s, ct_space))
				{
					if (*s == '\r')
					{
						*s++ = ' ';

						if (*s == '\n') g.push(s, 1);
					}
					else *s++ = ' ';
				}
				else if (opt_escape::value && *s == '&')
				{
					s = strconv_escape(s, g);
				}
				else if (!*s)
				{
					return NULL;
				}
				else ++s;
			}
		}